

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

Gia_Man_t * Abc_GenSignedBoothPPTest(int nArgA,int nArgB)

{
  int iLit0;
  Gia_Man_t *p;
  char *pcVar1;
  int local_1c;
  int iLit;
  int i;
  Gia_Man_t *pNew;
  int nArgB_local;
  int nArgA_local;
  
  p = Gia_ManStart(1000);
  pcVar1 = Abc_UtilStrsav("booth");
  p->pName = pcVar1;
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    Gia_ManAppendCi(p);
  }
  iLit0 = Abc_GenSignedBoothPP(p,2,4,6,8,10);
  Gia_ManAppendCo(p,iLit0);
  return p;
}

Assistant:

Gia_Man_t * Abc_GenSignedBoothPPTest( int nArgA, int nArgB )
{
    Gia_Man_t * pNew; int i, iLit;
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );
    for ( i = 0; i < 5; i++ )
         Gia_ManAppendCi(pNew);
    iLit = Abc_GenSignedBoothPP( pNew, 2, 4, 6, 8, 10 );
    Gia_ManAppendCo(pNew, iLit);
    return pNew;
}